

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O3

void __thiscall Pl_Flate::handleData(Pl_Flate *this,uchar *data,size_t len,int flush)

{
  action_e aVar1;
  undefined8 *puVar2;
  Members *pMVar3;
  Pipeline *pPVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  runtime_error *this_00;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int local_3c;
  char *local_38;
  
  if (len >> 0x20 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Pl_Flate: zlib doesn\'t support data blocks larger than int");
LAB_001353b3:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = (undefined8 *)
           ((this->m)._M_t.
            super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>._M_t.
            super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
            super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl)->zdata;
  *puVar2 = data;
  *(int *)(puVar2 + 1) = (int)len;
  pMVar3 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>._M_t.
           super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
           super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl;
  if (pMVar3->initialized == false) {
    if (pMVar3->action == a_deflate) {
      iVar6 = deflateInit_(puVar2,compression_level,"1.2.11",0x70);
    }
    else {
      iVar6 = inflateInit_(puVar2,"1.2.11",0x70);
    }
    checkError(this,"Init",iVar6);
    ((this->m)._M_t.
     super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>._M_t.
     super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
     super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl)->initialized = true;
  }
LAB_0013525a:
  do {
    if (((this->m)._M_t.
         super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>._M_t.
         super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
         super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl)->action == a_deflate) {
      iVar6 = deflate(puVar2,flush);
    }
    else {
      iVar6 = inflate(puVar2,flush);
    }
    pMVar3 = (this->m)._M_t.
             super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>._M_t.
             super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
             super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl;
    aVar1 = pMVar3->action;
    if ((((aVar1 == a_inflate) && (iVar6 != 0)) && ((char *)puVar2[6] != (char *)0x0)) &&
       (iVar7 = strcmp((char *)puVar2[6],"incorrect data check"), iVar7 == 0)) {
LAB_001352cb:
      bVar5 = true;
    }
    else {
      if (iVar6 != 0) {
        if (iVar6 == 1) goto LAB_001352cb;
        if (iVar6 == -5) {
          if ((pMVar3->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
            return;
          }
          local_38 = "input stream is complete but output may still be valid";
          local_3c = -5;
          (*(pMVar3->callback)._M_invoker)((_Any_data *)&pMVar3->callback,&local_38,&local_3c);
          return;
        }
        checkError(this,"data",iVar6);
        goto LAB_0013525a;
      }
      bVar5 = false;
    }
    uVar10 = (anonymous_namespace)::memory_limit_;
    if (*(int *)(puVar2 + 1) == 0) {
      bVar5 = (bool)((ulong)*(uint *)(puVar2 + 4) != 0 | bVar5);
    }
    lVar9 = pMVar3->out_bufsize - (ulong)*(uint *)(puVar2 + 4);
    if (lVar9 != 0) {
      if ((aVar1 != a_deflate && (anonymous_namespace)::memory_limit_ != 0) &&
         (uVar8 = pMVar3->written + lVar9, pMVar3->written = uVar8, uVar10 < uVar8)) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"PL_Flate memory limit exceeded");
        goto LAB_001353b3;
      }
      pPVar4 = (this->super_Pipeline).next_;
      (*pPVar4->_vptr_Pipeline[2])
                (pPVar4,(pMVar3->outbuf).
                        super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      puVar2[3] = (((this->m)._M_t.
                    super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>
                    .super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl)->outbuf).
                  super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pMVar3 = (this->m)._M_t.
               super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>.
               _M_t.
               super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
               super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl;
      uVar10 = pMVar3->out_bufsize;
      if (uVar10 >> 0x20 != 0) {
        QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::error(uVar10);
        uVar10 = pMVar3->out_bufsize;
      }
      *(int *)(puVar2 + 4) = (int)uVar10;
    }
    if (bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void
Pl_Flate::handleData(unsigned char const* data, size_t len, int flush)
{
    if (len > UINT_MAX) {
        throw std::runtime_error("Pl_Flate: zlib doesn't support data blocks larger than int");
    }
    z_stream& zstream = *(static_cast<z_stream*>(m->zdata));
    // zlib is known not to modify the data pointed to by next_in but doesn't declare the field
    // value const unless compiled to do so.
    zstream.next_in = const_cast<unsigned char*>(data);
    zstream.avail_in = QIntC::to_uint(len);

    if (!m->initialized) {
        int err = Z_OK;

        // deflateInit and inflateInit are macros that use old-style casts.
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic push
# pragma GCC diagnostic ignored "-Wold-style-cast"
#endif
        if (m->action == a_deflate) {
            err = deflateInit(&zstream, compression_level);
        } else {
            err = inflateInit(&zstream);
        }
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic pop
#endif

        checkError("Init", err);
        m->initialized = true;
    }

    int err = Z_OK;

    bool done = false;
    while (!done) {
        if (m->action == a_deflate) {
            err = deflate(&zstream, flush);
        } else {
            err = inflate(&zstream, flush);
        }
        if ((m->action == a_inflate) && (err != Z_OK) && zstream.msg &&
            (strcmp(zstream.msg, "incorrect data check") == 0)) {
            // Other PDF readers ignore this specific error. Combining this with Z_SYNC_FLUSH
            // enables qpdf to handle some broken zlib streams without losing data.
            err = Z_STREAM_END;
        }
        switch (err) {
        case Z_BUF_ERROR:
            // Probably shouldn't be able to happen, but possible as a boundary condition: if the
            // last call to inflate exactly filled the output buffer, it's possible that the next
            // call to inflate could have nothing to do. There are PDF files in the wild that have
            // this error (including at least one in qpdf's test suite). In some cases, we want to
            // know about this, because it indicates incorrect compression, so call a callback if
            // provided.
            this->warn("input stream is complete but output may still be valid", err);
            done = true;
            break;

        case Z_STREAM_END:
            done = true;
            // fall through

        case Z_OK:
            {
                if ((zstream.avail_in == 0) && (zstream.avail_out > 0)) {
                    // There is nothing left to read, and there was sufficient buffer space to write
                    // everything we needed, so we're done for now.
                    done = true;
                }
                uLong ready = QIntC::to_ulong(m->out_bufsize - zstream.avail_out);
                if (ready > 0) {
                    if (memory_limit_ && m->action != a_deflate) {
                        m->written += ready;
                        if (m->written > memory_limit_) {
                            throw std::runtime_error("PL_Flate memory limit exceeded");
                        }
                    }
                    next()->write(m->outbuf.get(), ready);
                    zstream.next_out = m->outbuf.get();
                    zstream.avail_out = QIntC::to_uint(m->out_bufsize);
                }
            }
            break;

        default:
            this->checkError("data", err);
            break;
        }
    }
}